

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntSort(Vec_Int_t *p,int fReverse)

{
  int fReverse_local;
  Vec_Int_t *p_local;
  
  if (fReverse == 0) {
    qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare1);
  }
  else {
    qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare2);
  }
  return;
}

Assistant:

static inline void Vec_IntSort( Vec_Int_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Vec_IntSortCompare2 );
    else
        qsort( (void *)p->pArray, (size_t)p->nSize, sizeof(int), 
                (int (*)(const void *, const void *)) Vec_IntSortCompare1 );
}